

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture2DArrayShadowGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float r;
  Texture2DArray *pTVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar12;
  float fVar13;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  fVar5 = c->in[0].m_data[3];
  s = c->in[0].m_data[0];
  pTVar1 = c->textures[0].tex2DArray;
  fVar3 = (float)pTVar1->m_width;
  t = c->in[0].m_data[1];
  fVar8 = (float)pTVar1->m_height;
  r = c->in[0].m_data[2];
  fVar4 = fVar3 * c->in[1].m_data[0];
  fVar6 = fVar3 * c->in[2].m_data[0];
  fVar7 = fVar3 * c->in[1].m_data[2];
  fVar3 = fVar3 * c->in[1].m_data[3];
  fVar9 = fVar8 * c->in[1].m_data[1];
  fVar12 = fVar8 * c->in[2].m_data[1];
  fVar13 = fVar8 * c->in[1].m_data[3];
  fVar8 = fVar8 * c->in[2].m_data[0];
  auVar10._0_4_ = fVar9 * fVar9;
  auVar10._4_4_ = fVar12 * fVar12;
  auVar10._8_4_ = fVar13 * fVar13;
  auVar10._12_4_ = fVar8 * fVar8;
  auVar11._0_4_ = fVar4 * fVar4 + auVar10._0_4_;
  auVar11._4_4_ = fVar6 * fVar6 + auVar10._4_4_;
  auVar11._8_4_ = fVar7 * fVar7 + auVar10._8_4_;
  auVar11._12_4_ = fVar3 * fVar3 + auVar10._12_4_;
  auVar11 = sqrtps(auVar10,auVar11);
  uVar2 = -(uint)(auVar11._4_4_ <= auVar11._0_4_);
  fVar3 = logf((float)(~uVar2 & (uint)auVar11._4_4_ | (uint)auVar11._0_4_ & uVar2));
  fVar5 = tcu::Texture2DArrayView::sampleCompare
                    (&(c->textures[0].tex2DArray)->m_view,&c->textures[0].sampler,fVar5,s,t,r,
                     fVar3 * 1.442695);
  (c->color).m_data[0] = fVar5;
  return;
}

Assistant:

static void		evalTexture2DArrayShadowGrad	(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DArrayShadow(c, c.in[0].w(), c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad2DArray(c)); }